

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names_internal.cc
# Opt level: O1

string * __thiscall
upb::generator::MiniTableSubMessagesVarName_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view msg_full_name)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  string local_30;
  
  (anonymous_namespace)::ToCIdent_abi_cxx11_(&local_30,(_anonymous_namespace_ *)this,msg_full_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MiniTableSubMessagesVarName(absl::string_view msg_full_name) {
  return ToCIdent(msg_full_name) + "__submsgs";
}